

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

BOOL __thiscall
Js::TypedArray<char,_false,_false>::DirectSetItemAtRange
          (TypedArray<char,_false,_false> *this,TypedArray<char,_false,_false> *fromArray,
          int32 iSrcStart,int32 iDstStart,uint32 length,_func_char_Var_ScriptContext_ptr *convFunc)

{
  Type puVar1;
  Type puVar2;
  code *pcVar3;
  bool bVar4;
  uchar uVar5;
  uint32 uVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar9;
  ScriptContext *pSVar10;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  uint local_84;
  uint local_7c;
  uint local_78;
  uint local_68;
  uint32 i;
  char undefinedValue;
  size_t byteSize;
  uint32 srcLength;
  uint32 dstLength;
  uint32 start;
  char *srcBuffer;
  char *dstBuffer;
  _func_char_Var_ScriptContext_ptr *convFunc_local;
  uint32 length_local;
  int32 iDstStart_local;
  int32 iSrcStart_local;
  TypedArray<char,_false,_false> *fromArray_local;
  TypedArray<char,_false,_false> *this_local;
  
  puVar1 = (this->super_TypedArrayBase).buffer;
  puVar2 = (fromArray->super_TypedArrayBase).buffer;
  if ((puVar2 == (Type)0x0) || (puVar1 == (Type)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x156,"(srcBuffer && dstBuffer)","srcBuffer && dstBuffer");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (0x7fffffff < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x157,
                                "(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName))",
                                "length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (iSrcStart != iDstStart) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x159,"(iSrcStart == iDstStart)","iSrcStart == iDstStart");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  bVar4 = Js::TypedArrayBase::IsDetachedBuffer(&this->super_TypedArrayBase);
  if ((!bVar4) &&
     (bVar4 = Js::TypedArrayBase::IsDetachedBuffer(&fromArray->super_TypedArrayBase), !bVar4)) {
    srcLength = iDstStart;
    convFunc_local._4_4_ = length;
    if (iDstStart < 0) {
      if ((long)((ulong)length + (long)iDstStart) < 0) {
        return 1;
      }
      convFunc_local._4_4_ = iDstStart + length;
      srcLength = 0;
    }
    uVar6 = UInt32Math::Add(srcLength,convFunc_local._4_4_);
    uVar7 = ArrayObject::GetLength((ArrayObject *)this);
    if (uVar6 < uVar7) {
      local_78 = convFunc_local._4_4_;
    }
    else {
      uVar6 = ArrayObject::GetLength((ArrayObject *)this);
      if (srcLength < uVar6) {
        uVar6 = ArrayObject::GetLength((ArrayObject *)this);
        local_7c = uVar6 - srcLength;
      }
      else {
        local_7c = 0;
      }
      local_78 = local_7c;
    }
    uVar6 = ArrayObject::GetLength((ArrayObject *)fromArray);
    if (srcLength + convFunc_local._4_4_ < uVar6) {
      local_84 = convFunc_local._4_4_;
    }
    else {
      uVar6 = ArrayObject::GetLength((ArrayObject *)fromArray);
      if (srcLength < uVar6) {
        uVar6 = ArrayObject::GetLength((ArrayObject *)fromArray);
        local_88 = uVar6 - srcLength;
      }
      else {
        local_88 = 0;
      }
      local_84 = local_88;
    }
    if (convFunc_local._4_4_ < local_84) {
      if (convFunc_local._4_4_ < local_78) {
        local_8c = convFunc_local._4_4_;
      }
      else {
        local_8c = local_78;
      }
      local_90 = local_8c;
    }
    else {
      if (local_84 < local_78) {
        local_94 = local_84;
      }
      else {
        local_94 = local_78;
      }
      local_90 = local_94;
    }
    js_memcpy_s(puVar1 + srcLength,(ulong)local_78,puVar2 + srcLength,(ulong)local_90);
    if (local_90 < local_78) {
      this_00 = RecyclableObject::GetLibrary((RecyclableObject *)this);
      pRVar9 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
      pSVar10 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      uVar5 = (*convFunc)(pRVar9,pSVar10);
      for (local_68 = local_90; local_68 < local_78; local_68 = local_68 + 1) {
        puVar1[local_68] = uVar5;
      }
    }
    return 1;
  }
  pSVar10 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  JavascriptError::ThrowTypeError(pSVar10,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

inline BOOL DirectSetItemAtRange(TypedArray *fromArray, __in int32 iSrcStart, __in int32 iDstStart, __in uint32 length, TypeName(*convFunc)(Var value, ScriptContext* scriptContext))
        {
            TypeName* dstBuffer = (TypeName*)buffer;
            TypeName* srcBuffer = (TypeName*)fromArray->buffer;
            Assert(srcBuffer && dstBuffer);
            Assert(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName));
            // caller checks that src and dst index are the same
            Assert(iSrcStart == iDstStart);

            if (this->IsDetachedBuffer() || fromArray->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            // Fixup destination start in case it's negative
            uint32 start = iDstStart;
            if (iDstStart < 0)
            {
                if ((int64)(length) + iDstStart < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }

                length += iDstStart;
                start = 0;
            }

            uint32 dstLength = UInt32Math::Add(start, length) < GetLength() ? length : GetLength() > start ? GetLength() - start : 0;
            uint32 srcLength = start + length < fromArray->GetLength() ? length : (fromArray->GetLength() > start ? fromArray->GetLength() - start : 0);

            // length is the minimum of length, srcLength and dstLength
            length = length < srcLength ? (length < dstLength ? length : dstLength) : (srcLength < dstLength ? srcLength : dstLength);

            const size_t byteSize = sizeof(TypeName) * length;
            Assert(byteSize >= length); // check for overflow
            js_memcpy_s(dstBuffer + start, dstLength * sizeof(TypeName), srcBuffer + start, byteSize);

            if (dstLength > length)
            {
                TypeName undefinedValue = convFunc(GetLibrary()->GetUndefined(), GetScriptContext());
                for (uint32 i = length; i < dstLength; i++)
                {
                    dstBuffer[i] = undefinedValue;
                }
            }

            return true;
        }